

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

upb_UnknownCompareResult CompareUnknown(UnknownFields *uf1,UnknownFields *uf2)

{
  upb_UnknownCompareResult uVar1;
  vector<UnknownField,_std::allocator<UnknownField>_> local_48;
  vector<UnknownField,_std::allocator<UnknownField>_> local_30;
  UnknownFields *local_18;
  UnknownFields *uf2_local;
  UnknownFields *uf1_local;
  
  local_18 = uf2;
  uf2_local = uf1;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_30,uf1);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_48,uf2);
  uVar1 = CompareUnknownWithMaxDepth(&local_30,&local_48,0x40);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_48);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_30);
  return uVar1;
}

Assistant:

upb_UnknownCompareResult CompareUnknown(UnknownFields uf1, UnknownFields uf2) {
  return CompareUnknownWithMaxDepth(uf1, uf2, 64);
}